

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O1

Var Js::JavascriptDate::EntryToString(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptDate *date;
  JavascriptString *pJVar6;
  ScriptContext *pSVar7;
  int in_stack_00000010;
  JavascriptString *local_40;
  Var result;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar7 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar7->threadContext,0xc00,pSVar7,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x62d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00bca3dc;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  pSVar7 = (ScriptContext *)&args.super_Arguments.Values;
  result = args.super_Arguments.Values;
  ArgumentReader::AdjustArguments((ArgumentReader *)&result,(CallInfo *)pSVar7);
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    pSVar7 = (ScriptContext *)0x630;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x630,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00bca3dc;
    *puVar4 = 0;
  }
  if (((ulong)result & 0xffffff) != 0) {
    pSVar7 = (ScriptContext *)0x0;
    pvVar5 = Arguments::operator[]((Arguments *)&result,0);
    bVar2 = VarIs<Js::JavascriptDate>(pvVar5);
    if (bVar2) {
      pvVar5 = Arguments::operator[]((Arguments *)&result,0);
      date = VarTo<Js::JavascriptDate>(pvVar5);
      if (((ulong)result & 0xffffff) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                    ,0x63d,"(args.Info.Count > 0)","Negative argument count");
        if (!bVar2) {
LAB_00bca3dc:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      pJVar6 = ToString(date,scriptContext);
      return pJVar6;
    }
  }
  local_40 = (JavascriptString *)0x0;
  BVar3 = TryInvokeRemotely(EntryToString,pSVar7,(Arguments *)&result,&local_40);
  if (BVar3 != 0) {
    return local_40;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec3d,L"Date.prototype.toString");
}

Assistant:

Var JavascriptDate::EntryToString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<JavascriptDate>(args[0]))
        {
            Var result = nullptr;
            if (TryInvokeRemotely(EntryToString, scriptContext, args, &result))
            {
                return result;
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDate, _u("Date.prototype.toString"));
        }
        JavascriptDate* date = VarTo<JavascriptDate>(args[0]);

        AssertMsg(args.Info.Count > 0, "Negative argument count");
        return JavascriptDate::ToString(date, scriptContext);
    }